

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O1

int Sbd_StoComputeCutsNode(Sbd_Sto_t *p,int iObj)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if (-1 < iObj) {
    if (iObj < p->pGia->nObjs) {
      uVar2 = *(undefined8 *)(p->pGia->pObjs + (uint)iObj);
      uVar4 = iObj - ((uint)uVar2 & 0x1fffffff);
      if (-1 < (int)uVar4) {
        iVar1 = p->vLevels->nSize;
        if ((((int)uVar4 < iVar1) &&
            (uVar6 = iObj - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff), -1 < (int)uVar6)) &&
           ((int)uVar6 < iVar1)) {
          piVar3 = p->vLevels->pArray;
          iVar1 = piVar3[uVar4];
          iVar5 = piVar3[uVar6];
          if (iVar5 < iVar1) {
            iVar5 = iVar1;
          }
          Sbd_StoComputeCutsObj(p,iObj,-1,iVar5 + 1);
          Sbd_StoMergeCuts(p,iObj);
          if (iObj < p->vDelays->nSize) {
            return p->vDelays->pArray[(uint)iObj];
          }
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Sbd_StoComputeCutsNode( Sbd_Sto_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int Lev0 = Vec_IntEntry( p->vLevels, Gia_ObjFaninId0(pObj, iObj) );
    int Lev1 = Vec_IntEntry( p->vLevels, Gia_ObjFaninId1(pObj, iObj) );
    Sbd_StoComputeCutsObj( p, iObj, -1, 1 + Abc_MaxInt(Lev0, Lev1) );
    Sbd_StoMergeCuts( p, iObj );
    return Vec_IntEntry( p->vDelays, iObj );
}